

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O1

Macros * __thiscall pstack::Dwarf::Unit::getMacros(Unit *this)

{
  unique_ptr<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_> *this_00;
  AttrName name;
  Info *dwarf;
  _Head_base<0UL,_pstack::Dwarf::Macros_*,_false> __ptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  intmax_t offset;
  _Head_base<0UL,_pstack::Dwarf::Macros_*,_false> this_01;
  undefined8 extraout_RAX;
  long lVar2;
  _Head_base<0UL,_pstack::Dwarf::Macros_*,_false> unaff_R13;
  pointer __p;
  DIE local_c0;
  undefined1 local_98 [8];
  Attribute a;
  Macros *local_40;
  ulong local_38;
  
  this_00 = &this->macros;
  if ((this->macros)._M_t.
      super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>._M_t
      .super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>.
      super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl == (Macros *)0x0) {
    root(&local_c0,this);
    stack0xffffffffffffff9c = 0x7900002119;
    local_38 = 0;
    lVar2 = 0;
    do {
      name = *(AttrName *)((long)&a.formp + lVar2 + 4);
      DIE::attribute((Attribute *)local_98,&local_c0,name,false);
      _Var1 = a.die.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      if (a.die.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        dwarf = this->dwarf;
        offset = DIE::Attribute::operator_cast_to_long((Attribute *)local_98);
        this_01._M_head_impl = (Macros *)operator_new(0x50);
        Macros::Macros(this_01._M_head_impl,dwarf,offset,name == DW_AT_macro_info ^ 5);
        local_40 = (Macros *)0x0;
        __ptr._M_head_impl =
             (this_00->_M_t).
             super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>
             .super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl;
        (this_00->_M_t).
        super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>.
        _M_t.
        super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>
        .super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl = this_01._M_head_impl;
        if (__ptr._M_head_impl != (Macros *)0x0) {
          std::default_delete<pstack::Dwarf::Macros>::operator()
                    ((default_delete<pstack::Dwarf::Macros> *)this_00,__ptr._M_head_impl);
        }
        if (local_40 != (Macros *)0x0) {
          std::default_delete<pstack::Dwarf::Macros>::operator()
                    ((default_delete<pstack::Dwarf::Macros> *)&local_40,local_40);
        }
        unaff_R13._M_head_impl =
             (this_00->_M_t).
             super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>
             .super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl;
      }
      DIE::~DIE((DIE *)local_98);
      if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) break;
      lVar2 = lVar2 + 4;
      local_38 = CONCAT71((int7)((ulong)extraout_RAX >> 8),lVar2 == 0xc);
    } while (lVar2 != 0xc);
    DIE::~DIE(&local_c0);
    if ((local_38 & 1) == 0) {
      return unaff_R13._M_head_impl;
    }
  }
  return (this_00->_M_t).
         super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>.
         _M_t.
         super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>
         .super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl;
}

Assistant:

const Macros *
Unit::getMacros()
{
    if (macros == nullptr) {
       const DIE &root_ = root();
       for (auto i : { DW_AT_GNU_macros, DW_AT_macros, DW_AT_macro_info }) {
          auto a = root_.attribute(i);
          if (a.valid()) {
              macros = std::make_unique<Macros>(*dwarf, intmax_t(a), i == DW_AT_macro_info ? 4 : 5);
              return macros.get();
          }
       }
    }
    return macros.get();
}